

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrdb.cpp
# Opt level: O3

void DumpAnchors(path *anchors_db_path,vector<CAddress,_std::allocator<CAddress>_> *anchors)

{
  string prefix;
  path src;
  string end_msg;
  path dest;
  _Alloc_hider __stream;
  bool bVar1;
  uint64_t uVar2;
  CChainParams *pCVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  int source_line;
  unsigned_short *args_1;
  LogFlags in_R9;
  undefined2 uVar4;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  uint16_t randv;
  Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> logging_timer6;
  path pathTmp;
  string tmpfn;
  HashedSourceWriter<AutoFile> hashwriter;
  Level in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  char *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  undefined2 in_stack_fffffffffffffdbc;
  undefined2 in_stack_fffffffffffffdbe;
  undefined8 in_stack_fffffffffffffdc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1_00;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd0;
  size_type in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  long *local_200 [2];
  long local_1f0 [2];
  Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_1e0;
  path local_180;
  path local_158;
  path local_130;
  string local_108;
  undefined1 local_e8 [16];
  undefined1 local_d8 [24];
  uchar auStack_c0 [24];
  byte local_a8 [40];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *local_80;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_200[0] = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"DumpAnchors","");
  local_e8._0_8_ =
       ((long)(anchors->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(anchors->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  tinyformat::format<unsigned_long>
            ((string *)&stack0xfffffffffffffde0,
             "Flush %d outbound block-relay-only peer addresses to anchors.dat",
             (unsigned_long *)local_e8);
  args_1 = (unsigned_short *)0x1;
  prefix._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffdac;
  prefix._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffda8;
  prefix._M_string_length = (size_type)in_stack_fffffffffffffdb0;
  prefix.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffdb8;
  prefix.field_2._M_allocated_capacity._4_2_ = in_stack_fffffffffffffdbc;
  prefix.field_2._M_allocated_capacity._6_2_ = in_stack_fffffffffffffdbe;
  prefix.field_2._8_8_ = in_stack_fffffffffffffdc0;
  end_msg._M_string_length = in_stack_fffffffffffffdd0;
  end_msg._M_dataplus._M_p = (pointer)in_stack_fffffffffffffdc8._M_head_impl;
  end_msg.field_2._M_allocated_capacity = in_stack_fffffffffffffdd8;
  end_msg.field_2._8_8_ = in_stack_fffffffffffffde0;
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::Timer
            (&local_1e0,prefix,end_msg,(LogFlags)local_200,SUB81(&stack0xfffffffffffffde0,0));
  if ((undefined1 *)in_stack_fffffffffffffde0 != &stack0xfffffffffffffdf0) {
    operator_delete((void *)in_stack_fffffffffffffde0,(ulong)(in_stack_fffffffffffffdf0 + 1));
  }
  if (local_200[0] != local_1f0) {
    operator_delete(local_200[0],local_1f0[0] + 1);
  }
  args_1_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &stack0xfffffffffffffdd0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffdc0,"anchors","");
  FastRandomContext::FastRandomContext((FastRandomContext *)local_e8,false);
  uVar2 = RandomMixin<FastRandomContext>::randbits<16>((RandomMixin<FastRandomContext> *)local_e8);
  ChaCha20::~ChaCha20((ChaCha20 *)local_d8);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &stack0xfffffffffffffdbc;
  uVar4 = (undefined2)uVar2;
  tinyformat::format<std::__cxx11::string,unsigned_short>
            (&local_108,(tinyformat *)"%s.%04x",&stack0xfffffffffffffdc0,args,args_1);
  source_line = (int)args_1;
  ArgsManager::GetDataDir((path *)&local_158,&gArgs,true);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::u8string::
  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((u8string *)&local_58,local_108._M_dataplus._M_p,
             local_108._M_dataplus._M_p + local_108._M_string_length);
  std::filesystem::__cxx11::path::path<std::__cxx11::u8string,std::filesystem::__cxx11::path>
            ((path *)local_e8,&local_58,auto_format);
  std::filesystem::__cxx11::path::path(&local_180,(path *)local_e8);
  std::filesystem::__cxx11::path::~path((path *)local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::operator/=(&local_158,(path *)&local_180);
  std::filesystem::__cxx11::path::path(&local_130,&local_158);
  std::filesystem::__cxx11::path::~path(&local_180);
  std::filesystem::__cxx11::path::~path(&local_158);
  local_58._M_dataplus._M_p = (pointer)fsbridge::fopen((char *)&local_130,"wb");
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  local_58.field_2._8_8_ = 0;
  if ((FILE *)local_58._M_dataplus._M_p == (FILE *)0x0) {
    local_58._M_dataplus._M_p = (pointer)0x0;
    std::filesystem::remove((path *)&local_130);
    local_e8._0_8_ = (ChaCha20 *)local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e8,local_130._M_pathname._M_dataplus._M_p,
               local_130._M_pathname._M_dataplus._M_p + local_130._M_pathname._M_string_length);
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrdb.cpp";
    source_file_00._M_len = 0x53;
    logging_function_00._M_str = "SerializeFileDB";
    logging_function_00._M_len = 0xf;
    LogPrintf_<char[16],std::__cxx11::string>
              (logging_function_00,source_file_00,0x42,
               IPC|I2P|VALIDATION|LEVELDB|QT|MEMPOOLREJ|PRUNE|CMPCTBLOCK|ADDRMAN|RPC|WALLETDB|HTTP|
               MEMPOOL|TOR,(Level)(string *)local_e8,in_stack_fffffffffffffdb0,
               (char (*) [16])
               CONCAT26(in_stack_fffffffffffffdbe,CONCAT24(uVar4,in_stack_fffffffffffffdb8)),
               args_1_00);
  }
  else {
    local_a8[0x10] = 0;
    local_a8[0x11] = 0;
    local_a8[0x12] = 0;
    local_a8[0x13] = 0;
    local_a8[0x14] = 0;
    local_a8[0x15] = 0;
    local_a8[0x16] = 0;
    local_a8[0x17] = 0;
    local_a8[0x18] = 0;
    local_a8[0x19] = 0;
    local_a8[0x1a] = 0;
    local_a8[0x1b] = 0;
    local_a8[0x1c] = 0;
    local_a8[0x1d] = 0;
    local_a8[0x1e] = 0;
    local_a8[0x1f] = 0;
    local_a8[0] = 0;
    local_a8[1] = 0;
    local_a8[2] = 0;
    local_a8[3] = 0;
    local_a8[4] = 0;
    local_a8[5] = 0;
    local_a8[6] = 0;
    local_a8[7] = 0;
    local_a8[8] = 0;
    local_a8[9] = 0;
    local_a8[10] = 0;
    local_a8[0xb] = 0;
    local_a8[0xc] = 0;
    local_a8[0xd] = 0;
    local_a8[0xe] = 0;
    local_a8[0xf] = 0;
    auStack_c0[8] = '\0';
    auStack_c0[9] = '\0';
    auStack_c0[10] = '\0';
    auStack_c0[0xb] = '\0';
    auStack_c0[0xc] = '\0';
    auStack_c0[0xd] = '\0';
    auStack_c0[0xe] = '\0';
    auStack_c0[0xf] = '\0';
    auStack_c0[0x10] = '\0';
    auStack_c0[0x11] = '\0';
    auStack_c0[0x12] = '\0';
    auStack_c0[0x13] = '\0';
    auStack_c0[0x14] = '\0';
    auStack_c0[0x15] = '\0';
    auStack_c0[0x16] = '\0';
    auStack_c0[0x17] = '\0';
    local_d8._16_8_ =
         (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
    auStack_c0[0] = '\0';
    auStack_c0[1] = '\0';
    auStack_c0[2] = '\0';
    auStack_c0[3] = '\0';
    auStack_c0[4] = '\0';
    auStack_c0[5] = '\0';
    auStack_c0[6] = '\0';
    auStack_c0[7] = '\0';
    local_d8._0_8_ = 0;
    local_d8._8_4_ = 0;
    local_d8._12_4_ = 0;
    local_e8._0_8_ = (ChaCha20 *)0x0;
    local_e8._8_8_ = 0;
    local_a8[0x20] = 0;
    local_a8[0x21] = 0;
    local_a8[0x22] = 0;
    local_a8[0x23] = 0;
    local_a8[0x24] = 0;
    local_a8[0x25] = 0;
    local_a8[0x26] = 0;
    local_a8[0x27] = 0;
    CSHA256::CSHA256((CSHA256 *)local_e8);
    local_80 = &local_58;
    pCVar3 = Params();
    AutoFile::write((AutoFile *)local_80,(int)&pCVar3->pchMessageStart,(void *)0x4,(size_t)args);
    CSHA256::Write((CSHA256 *)local_e8,(pCVar3->pchMessageStart)._M_elems,4);
    local_180._M_pathname._M_dataplus._M_p = (pointer)&CAddress::V2_DISK;
    local_180._M_pathname._M_string_length = (size_type)local_e8;
    VectorFormatter<DefaultFormatter>::
    Ser<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>,std::vector<CAddress,std::allocator<CAddress>>>
              ((VectorFormatter<DefaultFormatter> *)&stack0xfffffffffffffdbf,
               (ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *)&local_180,
               anchors);
    HashWriter::GetHash((uint256 *)&local_180,(HashWriter *)local_e8);
    AutoFile::write((AutoFile *)&local_58,(int)&local_180,(void *)0x20,(size_t)args);
    bVar1 = FileCommit((FILE *)local_58._M_dataplus._M_p);
    __stream._M_p = local_58._M_dataplus._M_p;
    local_58._M_dataplus._M_p = (pointer)0x0;
    if (bVar1) {
      if ((FILE *)__stream._M_p != (FILE *)0x0) {
        fclose((FILE *)__stream._M_p);
      }
      std::filesystem::__cxx11::path::path((path *)local_e8,&local_130);
      std::filesystem::__cxx11::path::path(&local_180,&anchors_db_path->super_path);
      src.super_path._M_pathname._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffdac;
      src.super_path._M_pathname._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffda8;
      src.super_path._M_pathname._M_string_length = (size_type)in_stack_fffffffffffffdb0;
      src.super_path._M_pathname.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffdb8;
      src.super_path._M_pathname.field_2._M_allocated_capacity._4_2_ = uVar4;
      src.super_path._M_pathname.field_2._M_allocated_capacity._6_2_ = in_stack_fffffffffffffdbe;
      src.super_path._M_pathname.field_2._8_8_ = args_1_00;
      src.super_path._M_cmpts._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
           (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              )in_stack_fffffffffffffdc8._M_head_impl;
      dest.super_path._M_pathname._M_string_length = in_stack_fffffffffffffdd8;
      dest.super_path._M_pathname._M_dataplus._M_p = (pointer)in_stack_fffffffffffffdd0;
      dest.super_path._M_pathname.field_2._M_allocated_capacity = in_stack_fffffffffffffde0;
      dest.super_path._M_pathname.field_2._8_8_ = in_stack_fffffffffffffde8;
      dest.super_path._M_cmpts._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
           (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              )in_stack_fffffffffffffdf0;
      bVar1 = RenameOver(src,dest);
      std::filesystem::__cxx11::path::~path(&local_180);
      std::filesystem::__cxx11::path::~path((path *)local_e8);
      if (!bVar1) {
        std::filesystem::remove((path *)&local_130);
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrdb.cpp";
        source_file._M_len = 0x53;
        logging_function._M_str = "SerializeFileDB";
        logging_function._M_len = 0xf;
        LogPrintf_<char[16]>
                  (logging_function,source_file,source_line,in_R9,in_stack_fffffffffffffda8,
                   in_stack_fffffffffffffdb0,
                   (char (*) [16])
                   CONCAT26(in_stack_fffffffffffffdbe,CONCAT24(uVar4,in_stack_fffffffffffffdb8)));
      }
      goto LAB_00843212;
    }
    if ((FILE *)__stream._M_p != (FILE *)0x0) {
      fclose((FILE *)__stream._M_p);
    }
    std::filesystem::remove((path *)&local_130);
    local_e8._0_8_ = (ChaCha20 *)local_d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e8,local_130._M_pathname._M_dataplus._M_p,
               local_130._M_pathname._M_dataplus._M_p + local_130._M_pathname._M_string_length);
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrdb.cpp";
    source_file_01._M_len = 0x53;
    logging_function_01._M_str = "SerializeFileDB";
    logging_function_01._M_len = 0xf;
    LogPrintf_<char[16],std::__cxx11::string>
              (logging_function_01,source_file_01,0x4f,
               IPC|I2P|VALIDATION|LEVELDB|QT|MEMPOOLREJ|PRUNE|CMPCTBLOCK|ADDRMAN|RPC|WALLETDB|ZMQ|
               HTTP|TOR,(Level)(string *)local_e8,in_stack_fffffffffffffdb0,
               (char (*) [16])
               CONCAT26(in_stack_fffffffffffffdbe,CONCAT24(uVar4,in_stack_fffffffffffffdb8)),
               args_1_00);
  }
  if ((ChaCha20 *)local_e8._0_8_ != (ChaCha20 *)local_d8) {
    operator_delete((void *)local_e8._0_8_,local_d8._0_8_ + 1);
  }
LAB_00843212:
  AutoFile::~AutoFile((AutoFile *)&local_58);
  std::filesystem::__cxx11::path::~path(&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if (args_1_00 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stack0xfffffffffffffdd0)
  {
    operator_delete(args_1_00,(ulong)(in_stack_fffffffffffffdd0 + 1));
  }
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::~Timer(&local_1e0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DumpAnchors(const fs::path& anchors_db_path, const std::vector<CAddress>& anchors)
{
    LOG_TIME_SECONDS(strprintf("Flush %d outbound block-relay-only peer addresses to anchors.dat", anchors.size()));
    SerializeFileDB("anchors", anchors_db_path, CAddress::V2_DISK(anchors));
}